

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_7::Validator::Validator
          (Validator *this,Errors *errors,Script *script,ValidateOptions *options)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&PTR__Validator_013e3a08;
  this->options_ = options;
  this->errors_ = errors;
  this->script_ = script;
  this->current_except_index_ = 0;
  this->current_module_ = (Module *)0x0;
  this->current_func_ = (Func *)0x0;
  this->current_table_index_ = 0;
  this->current_memory_index_ = 0;
  this->current_global_index_ = 0;
  this->num_imported_globals_ = 0;
  *(undefined8 *)&(this->typechecker_).error_callback_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->typechecker_).error_callback_.super__Function_base._M_functor + 8) =
       0;
  (this->typechecker_).error_callback_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->typechecker_).error_callback_._M_invoker = (_Invoker_type)0x0;
  (this->typechecker_).type_stack_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->typechecker_).type_stack_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->typechecker_).type_stack_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->typechecker_).label_stack_.
  super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->typechecker_).label_stack_.
  super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->typechecker_).label_stack_.
  super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->typechecker_).br_table_sig_ = (TypeVector *)0x0;
  this->expr_loc_ = (Location *)0x0;
  (this->result_).enum_ = Ok;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/validator.cc:230:7)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/validator.cc:230:7)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  std::function<void_(const_char_*)>::operator=
            (&(this->typechecker_).error_callback_,(function<void_(const_char_*)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

Validator::Validator(Errors* errors,
                     const Script* script,
                     const ValidateOptions& options)
    : options_(options), errors_(errors), script_(script) {
  typechecker_.set_error_callback(
      [this](const char* msg) { OnTypecheckerError(msg); });
}